

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O3

Extra_MmStep_t * Extra_MmStepStart(int nSteps)

{
  undefined1 auVar1 [16];
  int iVar2;
  Extra_MmStep_t *pEVar3;
  Extra_MmFixed_t **ppEVar4;
  Extra_MmFixed_t **ppEVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  Extra_MmFixed_t *pEVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pEVar3 = (Extra_MmStep_t *)calloc(1,0x30);
  pEVar3->nMems = nSteps;
  pEVar10 = (Extra_MmFixed_t *)(long)nSteps;
  ppEVar4 = (Extra_MmFixed_t **)malloc((long)pEVar10 * 8);
  pEVar3->pMems = ppEVar4;
  if (0 < nSteps) {
    uVar11 = 0;
    do {
      pEVar10 = Extra_MmFixedStart(8 << ((byte)uVar11 & 0x1f));
      ppEVar4[uVar11] = pEVar10;
      uVar11 = uVar11 + 1;
    } while ((uint)nSteps != uVar11);
    pEVar10 = *ppEVar4;
  }
  iVar2 = 4 << ((byte)nSteps & 0x1f);
  pEVar3->nMapSize = iVar2;
  ppEVar5 = (Extra_MmFixed_t **)malloc((long)(iVar2 + 1) << 3);
  pEVar3->pMap = ppEVar5;
  *ppEVar5 = (Extra_MmFixed_t *)0x0;
  auVar12._8_4_ = (int)pEVar10;
  auVar12._0_8_ = pEVar10;
  auVar12._12_4_ = (int)((ulong)pEVar10 >> 0x20);
  *(undefined1 (*) [16])(ppEVar5 + 1) = auVar12;
  *(undefined1 (*) [16])(ppEVar5 + 3) = auVar12;
  auVar1 = _DAT_007ee2e0;
  auVar12 = _DAT_007ee2d0;
  if (0 < nSteps) {
    uVar11 = 0;
    do {
      iVar7 = 4 << ((byte)uVar11 & 0x1f);
      iVar2 = 8 << ((byte)uVar11 & 0x1f);
      if (iVar7 < iVar2) {
        pEVar10 = ppEVar4[uVar11];
        uVar6 = (iVar2 - iVar7) - 4;
        uVar8 = uVar6 | 3;
        auVar13._4_4_ = 0;
        auVar13._0_4_ = uVar8;
        auVar13._8_4_ = uVar8;
        auVar13._12_4_ = 0;
        auVar13 = auVar13 ^ auVar1;
        lVar9 = 0;
        do {
          auVar14._8_4_ = (int)lVar9;
          auVar14._0_8_ = lVar9;
          auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar14 = (auVar14 | auVar12) ^ auVar1;
          if ((bool)(~(auVar13._4_4_ < auVar14._4_4_ ||
                      auVar13._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar13._4_4_) & 1)) {
            ppEVar5[(long)iVar7 + lVar9 + 1] = pEVar10;
          }
          if (auVar14._12_4_ <= auVar13._12_4_ &&
              (auVar14._8_4_ <= auVar13._8_4_ || auVar14._12_4_ != auVar13._12_4_)) {
            ppEVar5[(long)iVar7 + lVar9 + 2] = pEVar10;
          }
          lVar9 = lVar9 + 2;
        } while ((ulong)uVar6 + 4 != lVar9);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)nSteps);
  }
  return pEVar3;
}

Assistant:

Extra_MmStep_t * Extra_MmStepStart( int nSteps )
{
    Extra_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Extra_MmStep_t, 1 );
    memset( p, 0, sizeof(Extra_MmStep_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Extra_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Extra_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Extra_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    return p;
}